

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_curve25519.c
# Opt level: O0

int main(int argc,char **argv)

{
  uchar local_a8d [8];
  char pers [5];
  uchar srv_to_cli [32];
  uchar cli_to_srv [32];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_ecdh_context ctx_srv;
  mbedtls_ecdh_context ctx_cli;
  int ret;
  char **argv_local;
  int argc_local;
  
  builtin_memcpy(local_a8d,"ecdh",5);
  mbedtls_ecdh_init((mbedtls_ecdh_context *)&ctx_srv._d.p);
  mbedtls_ecdh_init((mbedtls_ecdh_context *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(cli_to_srv + 0x18));
  printf("  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  ctx_cli._d.p._4_4_ =
       mbedtls_ctr_drbg_seed
                 ((mbedtls_ctr_drbg_context *)(cli_to_srv + 0x18),mbedtls_entropy_func,
                  &ctr_drbg.p_entropy,local_a8d,5);
  if (ctx_cli._d.p._4_4_ == 0) {
    printf(" ok\n");
    printf("  . Setting up client context...");
    fflush(_stdout);
    ctx_cli._d.p._4_4_ =
         mbedtls_ecp_group_load((mbedtls_ecp_group *)&ctx_srv._d.p,MBEDTLS_ECP_DP_CURVE25519);
    if (ctx_cli._d.p._4_4_ == 0) {
      ctx_cli._d.p._4_4_ =
           mbedtls_ecdh_gen_public
                     ((mbedtls_ecp_group *)&ctx_srv._d.p,(mbedtls_mpi *)&ctx_cli.grp.T_size,
                      (mbedtls_ecp_point *)&ctx_cli.d.p,mbedtls_ctr_drbg_random,cli_to_srv + 0x18);
      if (ctx_cli._d.p._4_4_ == 0) {
        ctx_cli._d.p._4_4_ =
             mbedtls_mpi_write_binary((mbedtls_mpi *)&ctx_cli.d.p,srv_to_cli + 0x18,0x20);
        if (ctx_cli._d.p._4_4_ == 0) {
          printf(" ok\n");
          printf("  . Setting up server context...");
          fflush(_stdout);
          ctx_cli._d.p._4_4_ =
               mbedtls_ecp_group_load
                         ((mbedtls_ecp_group *)&entropy.source[0x13].strong,
                          MBEDTLS_ECP_DP_CURVE25519);
          if (ctx_cli._d.p._4_4_ == 0) {
            ctx_cli._d.p._4_4_ =
                 mbedtls_ecdh_gen_public
                           ((mbedtls_ecp_group *)&entropy.source[0x13].strong,
                            (mbedtls_mpi *)&ctx_srv.grp.T_size,(mbedtls_ecp_point *)&ctx_srv.d.p,
                            mbedtls_ctr_drbg_random,cli_to_srv + 0x18);
            if (ctx_cli._d.p._4_4_ == 0) {
              ctx_cli._d.p._4_4_ =
                   mbedtls_mpi_write_binary((mbedtls_mpi *)&ctx_srv.d.p,local_a8d + 5,0x20);
              if (ctx_cli._d.p._4_4_ == 0) {
                printf(" ok\n");
                printf("  . Server reading client key and computing secret...");
                fflush(_stdout);
                ctx_cli._d.p._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&ctx_srv.Qp.Y.p,1);
                if (ctx_cli._d.p._4_4_ == 0) {
                  ctx_cli._d.p._4_4_ =
                       mbedtls_mpi_read_binary((mbedtls_mpi *)&ctx_srv.Q.Z.p,srv_to_cli + 0x18,0x20)
                  ;
                  if (ctx_cli._d.p._4_4_ == 0) {
                    ctx_cli._d.p._4_4_ =
                         mbedtls_ecdh_compute_shared
                                   ((mbedtls_ecp_group *)&entropy.source[0x13].strong,
                                    (mbedtls_mpi *)&ctx_srv.Qp.Z.p,
                                    (mbedtls_ecp_point *)&ctx_srv.Q.Z.p,
                                    (mbedtls_mpi *)&ctx_srv.grp.T_size,mbedtls_ctr_drbg_random,
                                    cli_to_srv + 0x18);
                    if (ctx_cli._d.p._4_4_ == 0) {
                      printf(" ok\n");
                      printf("  . Client reading server key and computing secret...");
                      fflush(_stdout);
                      ctx_cli._d.p._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&ctx_cli.Qp.Y.p,1);
                      if (ctx_cli._d.p._4_4_ == 0) {
                        ctx_cli._d.p._4_4_ =
                             mbedtls_mpi_read_binary
                                       ((mbedtls_mpi *)&ctx_cli.Q.Z.p,local_a8d + 5,0x20);
                        if (ctx_cli._d.p._4_4_ == 0) {
                          ctx_cli._d.p._4_4_ =
                               mbedtls_ecdh_compute_shared
                                         ((mbedtls_ecp_group *)&ctx_srv._d.p,
                                          (mbedtls_mpi *)&ctx_cli.Qp.Z.p,
                                          (mbedtls_ecp_point *)&ctx_cli.Q.Z.p,
                                          (mbedtls_mpi *)&ctx_cli.grp.T_size,mbedtls_ctr_drbg_random
                                          ,cli_to_srv + 0x18);
                          if (ctx_cli._d.p._4_4_ == 0) {
                            printf(" ok\n");
                            printf("  . Checking if both computed secrets are equal...");
                            fflush(_stdout);
                            ctx_cli._d.p._4_4_ =
                                 mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&ctx_cli.Qp.Z.p,
                                                     (mbedtls_mpi *)&ctx_srv.Qp.Z.p);
                            if (ctx_cli._d.p._4_4_ == 0) {
                              printf(" ok\n");
                            }
                            else {
                              printf(" failed\n  ! mbedtls_ecdh_compute_shared returned %d\n",
                                     (ulong)ctx_cli._d.p._4_4_);
                            }
                          }
                          else {
                            printf(" failed\n  ! mbedtls_ecdh_compute_shared returned %d\n",
                                   (ulong)ctx_cli._d.p._4_4_);
                          }
                        }
                        else {
                          printf(" failed\n  ! mbedtls_mpi_read_binary returned %d\n",
                                 (ulong)ctx_cli._d.p._4_4_);
                        }
                      }
                      else {
                        printf(" failed\n  ! mbedtls_mpi_lset returned %d\n",
                               (ulong)ctx_cli._d.p._4_4_);
                      }
                    }
                    else {
                      printf(" failed\n  ! mbedtls_ecdh_compute_shared returned %d\n",
                             (ulong)ctx_cli._d.p._4_4_);
                    }
                  }
                  else {
                    printf(" failed\n  ! mbedtls_mpi_read_binary returned %d\n",
                           (ulong)ctx_cli._d.p._4_4_);
                  }
                }
                else {
                  printf(" failed\n  ! mbedtls_mpi_lset returned %d\n",(ulong)ctx_cli._d.p._4_4_);
                }
              }
              else {
                printf(" failed\n  ! mbedtls_mpi_write_binary returned %d\n",
                       (ulong)ctx_cli._d.p._4_4_);
              }
            }
            else {
              printf(" failed\n  ! mbedtls_ecdh_gen_public returned %d\n",(ulong)ctx_cli._d.p._4_4_)
              ;
            }
          }
          else {
            printf(" failed\n  ! mbedtls_ecp_group_load returned %d\n",(ulong)ctx_cli._d.p._4_4_);
          }
        }
        else {
          printf(" failed\n  ! mbedtls_mpi_write_binary returned %d\n",(ulong)ctx_cli._d.p._4_4_);
        }
      }
      else {
        printf(" failed\n  ! mbedtls_ecdh_gen_public returned %d\n",(ulong)ctx_cli._d.p._4_4_);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ecp_group_load returned %d\n",(ulong)ctx_cli._d.p._4_4_);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)ctx_cli._d.p._4_4_);
  }
  mbedtls_ecdh_free((mbedtls_ecdh_context *)&entropy.source[0x13].strong);
  mbedtls_ecdh_free((mbedtls_ecdh_context *)&ctx_srv._d.p);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(cli_to_srv + 0x18));
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return (int)(ctx_cli._d.p._4_4_ != 0);
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;
    mbedtls_ecdh_context ctx_cli, ctx_srv;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char cli_to_srv[32], srv_to_cli[32];
    const char pers[] = "ecdh";
    ((void) argc);
    ((void) argv);

    mbedtls_ecdh_init( &ctx_cli );
    mbedtls_ecdh_init( &ctx_srv );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * Initialize random number generation
     */
    mbedtls_printf( "  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               sizeof pers ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Client: inialize context and generate keypair
     */
    mbedtls_printf( "  . Setting up client context..." );
    fflush( stdout );

    ret = mbedtls_ecp_group_load( &ctx_cli.grp, MBEDTLS_ECP_DP_CURVE25519 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_load returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_gen_public( &ctx_cli.grp, &ctx_cli.d, &ctx_cli.Q,
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_gen_public returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_write_binary( &ctx_cli.Q.X, cli_to_srv, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_binary returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Server: initialize context and generate keypair
     */
    mbedtls_printf( "  . Setting up server context..." );
    fflush( stdout );

    ret = mbedtls_ecp_group_load( &ctx_srv.grp, MBEDTLS_ECP_DP_CURVE25519 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecp_group_load returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_gen_public( &ctx_srv.grp, &ctx_srv.d, &ctx_srv.Q,
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_gen_public returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_write_binary( &ctx_srv.Q.X, srv_to_cli, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_write_binary returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Server: read peer's key and generate shared secret
     */
    mbedtls_printf( "  . Server reading client key and computing secret..." );
    fflush( stdout );

    ret = mbedtls_mpi_lset( &ctx_srv.Qp.Z, 1 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_lset returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_read_binary( &ctx_srv.Qp.X, cli_to_srv, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_binary returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_compute_shared( &ctx_srv.grp, &ctx_srv.z,
                                       &ctx_srv.Qp, &ctx_srv.d,
                                       mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Client: read peer's key and generate shared secret
     */
    mbedtls_printf( "  . Client reading server key and computing secret..." );
    fflush( stdout );

    ret = mbedtls_mpi_lset( &ctx_cli.Qp.Z, 1 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_lset returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_mpi_read_binary( &ctx_cli.Qp.X, srv_to_cli, 32 );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_binary returned %d\n", ret );
        goto exit;
    }

    ret = mbedtls_ecdh_compute_shared( &ctx_cli.grp, &ctx_cli.z,
                                       &ctx_cli.Qp, &ctx_cli.d,
                                       mbedtls_ctr_drbg_random, &ctr_drbg );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * Verification: are the computed secret equal?
     */
    mbedtls_printf( "  . Checking if both computed secrets are equal..." );
    fflush( stdout );

    ret = mbedtls_mpi_cmp_mpi( &ctx_cli.z, &ctx_srv.z );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ecdh_compute_shared returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );


exit:

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    mbedtls_ecdh_free( &ctx_srv );
    mbedtls_ecdh_free( &ctx_cli );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

    return( ret != 0 );
}